

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  uchar *puVar5;
  Mat *pMVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  uchar *ptr_5;
  int j_1;
  Mat m;
  uchar *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int h_4;
  int w_5;
  uchar *ptr_4;
  uchar *outptr_4;
  int size_2;
  int p;
  Mat *top_blob_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int h_3;
  int w_4;
  uchar *outptr_3;
  uchar *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  uchar *ptr_2;
  uchar *outptr_2;
  int j;
  Mat *top_blob_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  uchar *outptr_1;
  uchar *ptr_1;
  int size;
  Mat *top_blob_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  uchar *outptr;
  uchar *ptr;
  Mat *top_blob;
  int slice;
  size_t i;
  int q;
  int w;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  uchar *in_stack_fffffffffffffc50;
  ulong in_stack_fffffffffffffc58;
  Mat *in_stack_fffffffffffffc60;
  Mat *this_00;
  int local_304;
  Mat local_300;
  Mat local_2c0;
  uchar *local_280;
  int local_274;
  reference local_270;
  int local_264;
  Mat *local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  Mat local_248;
  uchar *local_208;
  Mat local_200;
  uchar *local_1c0;
  int local_1b8;
  int local_1b4;
  reference local_1b0;
  int local_1a4;
  ulong local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  uchar *local_188;
  Mat local_170;
  uchar *local_130;
  int local_124;
  reference local_120;
  int local_114;
  ulong local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  uchar *local_f8;
  uchar *local_f0;
  int local_e4;
  reference local_e0;
  int local_d4;
  ulong local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  uchar *local_b8;
  uchar *local_b0;
  int local_a4;
  reference local_a0;
  int local_94;
  ulong local_90;
  int local_84;
  int local_80;
  int local_7c;
  uchar *local_78;
  uchar *local_70;
  reference local_68;
  int local_5c;
  ulong local_58;
  int local_50;
  int local_4c;
  int *local_48;
  size_t local_40;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  
  local_20 = in_RDX;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->dims;
  local_40 = local_30->elemsize;
  local_48 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xb8));
  if (local_34 == 1) {
    local_4c = local_30->w;
    local_50 = 0;
    for (local_58 = 0; uVar1 = local_58,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar1 < sVar4;
        local_58 = local_58 + 1) {
      local_5c = local_48[local_58];
      if (local_5c == -0xe9) {
        iVar3 = local_4c - local_50;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_5c = (int)((ulong)(long)iVar3 / (sVar4 - local_58));
      }
      local_68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_58);
      Mat::create(in_stack_fffffffffffffc60,(int)(in_stack_fffffffffffffc58 >> 0x20),
                  (size_t)in_stack_fffffffffffffc50,(Allocator *)in_stack_fffffffffffffc48);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      local_70 = Mat::operator_cast_to_unsigned_char_(local_30);
      local_70 = local_70 + (long)local_50 * local_40;
      local_78 = Mat::operator_cast_to_unsigned_char_(local_68);
      memcpy(local_78,local_70,(long)local_5c * local_40);
      local_50 = local_5c + local_50;
    }
  }
  else if ((local_34 == 2) && (*(int *)(in_RDI + 0xf8) == 0)) {
    local_7c = local_30->w;
    local_80 = local_30->h;
    local_84 = 0;
    for (local_90 = 0; uVar1 = local_90,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar1 < sVar4;
        local_90 = local_90 + 1) {
      local_94 = local_48[local_90];
      if (local_94 == -0xe9) {
        iVar3 = local_80 - local_84;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_94 = (int)((ulong)(long)iVar3 / (sVar4 - local_90));
      }
      local_a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_90);
      Mat::create(in_stack_fffffffffffffc60,(int)(in_stack_fffffffffffffc58 >> 0x20),
                  (int)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                  (Allocator *)in_stack_fffffffffffffc48);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      local_a4 = local_7c * local_94;
      local_b0 = Mat::row<unsigned_char_const>(local_30,local_84);
      local_b8 = Mat::operator_cast_to_unsigned_char_(local_a0);
      memcpy(local_b8,local_b0,(long)local_a4 * local_40);
      local_84 = local_94 + local_84;
    }
  }
  else if ((local_34 == 2) && (*(int *)(in_RDI + 0xf8) == 1)) {
    local_bc = local_30->w;
    local_c0 = local_30->h;
    local_c4 = 0;
    for (local_d0 = 0; uVar1 = local_d0,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar1 < sVar4;
        local_d0 = local_d0 + 1) {
      local_d4 = local_48[local_d0];
      if (local_d4 == -0xe9) {
        iVar3 = local_bc - local_c4;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_d4 = (int)((ulong)(long)iVar3 / (sVar4 - local_d0));
      }
      local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d0);
      Mat::create(in_stack_fffffffffffffc60,(int)(in_stack_fffffffffffffc58 >> 0x20),
                  (int)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50,
                  (Allocator *)in_stack_fffffffffffffc48);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      for (local_e4 = 0; local_e4 < local_c0; local_e4 = local_e4 + 1) {
        local_f0 = Mat::row<unsigned_char>(local_e0,local_e4);
        local_f8 = Mat::row<unsigned_char_const>(local_30,local_e4);
        local_f8 = local_f8 + (long)local_c4 * local_40;
        memcpy(local_f0,local_f8,(long)local_d4 * local_40);
      }
      local_c4 = local_d4 + local_c4;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xf8) == 0)) {
    local_fc = local_30->w;
    local_100 = local_30->h;
    local_104 = local_30->c;
    local_108 = 0;
    for (local_110 = 0; uVar1 = local_110,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar1 < sVar4;
        local_110 = local_110 + 1) {
      local_114 = local_48[local_110];
      if (local_114 == -0xe9) {
        iVar3 = local_104 - local_108;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_114 = (int)((ulong)(long)iVar3 / (sVar4 - local_110));
      }
      local_120 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_110)
      ;
      Mat::create(in_stack_fffffffffffffc60,(int)(in_stack_fffffffffffffc58 >> 0x20),
                  (int)in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                  (size_t)in_stack_fffffffffffffc48,(Allocator *)in_stack_fffffffffffffc40);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      local_124 = (int)local_30->cstep * local_114;
      Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
      puVar5 = Mat::operator_cast_to_unsigned_char_(&local_170);
      Mat::~Mat((Mat *)0x17ee82);
      local_130 = puVar5;
      local_188 = Mat::operator_cast_to_unsigned_char_(local_120);
      memcpy(local_188,local_130,(long)local_124 * local_40);
      local_108 = local_114 + local_108;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xf8) == 1)) {
    local_18c = local_30->w;
    local_190 = local_30->h;
    local_194 = local_30->c;
    local_198 = 0;
    for (local_1a0 = 0; uVar1 = local_1a0,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar1 < sVar4;
        local_1a0 = local_1a0 + 1) {
      local_1a4 = local_48[local_1a0];
      if (local_1a4 == -0xe9) {
        iVar3 = local_190 - local_198;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_1a4 = (int)((ulong)(long)iVar3 / (sVar4 - local_1a0));
      }
      local_1b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_1a0)
      ;
      Mat::create(in_stack_fffffffffffffc60,(int)(in_stack_fffffffffffffc58 >> 0x20),
                  (int)in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                  (size_t)in_stack_fffffffffffffc48,(Allocator *)in_stack_fffffffffffffc40);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      for (local_1b4 = 0; local_1b4 < local_194; local_1b4 = local_1b4 + 1) {
        local_1b8 = local_18c * local_1a4;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        puVar5 = Mat::operator_cast_to_unsigned_char_(&local_200);
        Mat::~Mat((Mat *)0x17f11a);
        local_1c0 = puVar5;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        puVar5 = Mat::row<unsigned_char_const>(&local_248,local_198);
        Mat::~Mat((Mat *)0x17f16d);
        local_208 = puVar5;
        memcpy(local_1c0,puVar5,(long)local_1b8 * local_40);
      }
      local_198 = local_1a4 + local_198;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xf8) == 2)) {
    local_24c = local_30->w;
    local_250 = local_30->h;
    local_254 = local_30->c;
    local_258 = 0;
    local_260 = (Mat *)0x0;
    while (this_00 = local_260,
          pMVar6 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20),
          this_00 < pMVar6) {
      local_264 = local_48[(long)local_260];
      if (local_264 == -0xe9) {
        in_stack_fffffffffffffc58 = (ulong)(local_24c - local_258);
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_264 = (int)(in_stack_fffffffffffffc58 / (sVar4 - (long)local_260));
      }
      local_270 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_20,(size_type)local_260);
      Mat::create(this_00,(int)(in_stack_fffffffffffffc58 >> 0x20),(int)in_stack_fffffffffffffc58,
                  (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar2 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar2) {
        return -100;
      }
      for (local_274 = 0; local_274 < local_254; local_274 = local_274 + 1) {
        in_stack_fffffffffffffc48 = &local_2c0;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        in_stack_fffffffffffffc50 = Mat::operator_cast_to_unsigned_char_(in_stack_fffffffffffffc48);
        Mat::~Mat((Mat *)0x17f414);
        local_280 = in_stack_fffffffffffffc50;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        for (local_304 = 0; local_304 < local_250; local_304 = local_304 + 1) {
          in_stack_fffffffffffffc40 = (Mat *)Mat::row<unsigned_char_const>(&local_300,local_304);
          memcpy(local_280,
                 (void **)((long)&in_stack_fffffffffffffc40->data + (long)local_258 * local_40),
                 (long)local_264 * local_40);
          local_280 = local_280 + (long)local_264 * local_40;
        }
        Mat::~Mat((Mat *)0x17f54b);
      }
      local_258 = local_264 + local_258;
      local_260 = (Mat *)((long)&local_260->data + 1);
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}